

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::WindowDataParameter::WindowDataParameter(WindowDataParameter *this,WindowDataParameter *from)

{
  void *pvVar1;
  string *psVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint32 uVar6;
  uint32 uVar7;
  bool bVar8;
  bool bVar9;
  undefined2 uVar10;
  uint32 uVar11;
  uint uVar12;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__WindowDataParameter_006faed0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->source_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar12 = (from->_has_bits_).has_bits_[0];
  if (((uVar12 & 1) != 0) &&
     (psVar2 = (from->source_).ptr_,
     psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->source_,psVar2);
    uVar12 = (from->_has_bits_).has_bits_[0];
  }
  (this->mean_file_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if (((uVar12 & 2) != 0) &&
     (psVar2 = (from->mean_file_).ptr_,
     psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->mean_file_,psVar2);
    uVar12 = (from->_has_bits_).has_bits_[0];
  }
  (this->crop_mode_).ptr_ = (string *)&_default_crop_mode__abi_cxx11_;
  if (((uVar12 & 4) != 0) &&
     (psVar2 = (from->crop_mode_).ptr_, psVar2 != (string *)&_default_crop_mode__abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->crop_mode_,psVar2);
    uVar12 = (from->_has_bits_).has_bits_[0];
  }
  (this->root_folder_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if (((uVar12 & 8) != 0) &&
     (psVar2 = (from->root_folder_).ptr_,
     psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->root_folder_,psVar2);
  }
  uVar6 = from->batch_size_;
  uVar7 = from->crop_size_;
  bVar8 = from->mirror_;
  bVar9 = from->cache_images_;
  uVar10 = *(undefined2 *)&from->field_0x42;
  uVar11 = from->context_pad_;
  fVar3 = from->fg_threshold_;
  fVar4 = from->bg_threshold_;
  fVar5 = from->fg_fraction_;
  this->scale_ = from->scale_;
  this->fg_threshold_ = fVar3;
  this->bg_threshold_ = fVar4;
  this->fg_fraction_ = fVar5;
  this->batch_size_ = uVar6;
  this->crop_size_ = uVar7;
  this->mirror_ = bVar8;
  this->cache_images_ = bVar9;
  *(undefined2 *)&this->field_0x42 = uVar10;
  this->context_pad_ = uVar11;
  return;
}

Assistant:

WindowDataParameter::WindowDataParameter(const WindowDataParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  source_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_source()) {
    source_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.source_);
  }
  mean_file_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_mean_file()) {
    mean_file_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.mean_file_);
  }
  crop_mode_.UnsafeSetDefault(&WindowDataParameter::_default_crop_mode_.get());
  if (from.has_crop_mode()) {
    crop_mode_.AssignWithDefault(&WindowDataParameter::_default_crop_mode_.get(), from.crop_mode_);
  }
  root_folder_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_root_folder()) {
    root_folder_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.root_folder_);
  }
  ::memcpy(&batch_size_, &from.batch_size_,
    reinterpret_cast<char*>(&fg_fraction_) -
    reinterpret_cast<char*>(&batch_size_) + sizeof(fg_fraction_));
  // @@protoc_insertion_point(copy_constructor:caffe.WindowDataParameter)
}